

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_reader_utils.c
# Opt level: O0

void VP8LDoFillBitWindow(VP8LBitReader *br)

{
  uint32_t uVar1;
  ulong *in_RDI;
  
  if (in_RDI[3] + 8 < in_RDI[2]) {
    *in_RDI = *in_RDI >> 0x20;
    *(int *)(in_RDI + 4) = (int)in_RDI[4] + -0x20;
    uVar1 = WebPMemToUint32((uint8_t *)(in_RDI[1] + in_RDI[3]));
    *in_RDI = (ulong)uVar1 << 0x20 | *in_RDI;
    in_RDI[3] = in_RDI[3] + 4;
  }
  else {
    ShiftBytes(br);
  }
  return;
}

Assistant:

void VP8LDoFillBitWindow(VP8LBitReader* const br) {
  assert(br->bit_pos_ >= VP8L_WBITS);
#if defined(VP8L_USE_FAST_LOAD)
  if (br->pos_ + sizeof(br->val_) < br->len_) {
    br->val_ >>= VP8L_WBITS;
    br->bit_pos_ -= VP8L_WBITS;
    br->val_ |= (vp8l_val_t)HToLE32(WebPMemToUint32(br->buf_ + br->pos_)) <<
                (VP8L_LBITS - VP8L_WBITS);
    br->pos_ += VP8L_LOG8_WBITS;
    return;
  }
#endif
  ShiftBytes(br);       // Slow path.
}